

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::run_finalizers(CVmObjTable *this)

{
  CVmObjPageEntry *pCVar1;
  uint uVar2;
  vm_obj_id_t id;
  
  uVar2 = this->finalize_queue_head_;
  while (uVar2 != 0) {
    pCVar1 = this->pages_[uVar2 >> 0xc] + (uVar2 & 0xfff);
    this->finalize_queue_head_ = pCVar1->next_obj_;
    *(ushort *)&pCVar1->field_0x14 = (ushort)*(undefined4 *)&pCVar1->field_0x14 & 0xffc3 | 0x20;
    (**(code **)(*(long *)&pCVar1->ptr_ + 0x28))();
    uVar2 = this->finalize_queue_head_;
  }
  return;
}

Assistant:

void CVmObjTable::run_finalizers(VMG0_)
{
    /* keep going until we run out of work or reach our work limit */
    while (finalize_queue_head_ != VM_INVALID_OBJ)
    {
        CVmObjPageEntry *entry;
        vm_obj_id_t id;

        /* get the next object from the queue */
        id = finalize_queue_head_;

        /* get the entry */
        entry = get_entry(id);

        /* remove the entry form the queue */
        finalize_queue_head_ = entry->next_obj_;

        /* mark the object as finalized */
        entry->finalize_state_ = VMOBJ_FINALIZED;

        /* 
         *   the entry is no longer in any queue, so we must mark it as
         *   unreachable -- this ensures that the initial conditions are
         *   correct for the next garbage collection pass, since all
         *   objects not in the work queue must be marked as unreachable
         *   (it doesn't matter whether the object is actually reachable;
         *   the garbage collector will make that determination when it
         *   next runs) 
         */
        entry->reachable_ = VMOBJ_UNREACHABLE;
        
        /* invoke its finalizer */
        entry->get_vm_obj()->invoke_finalizer(vmg_ id);
    }
}